

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

double __thiscall units::detail::unit_data::pow(unit_data *this,double __x,double __y)

{
  unit_data uVar1;
  unit_data uVar2;
  int iVar3;
  uint iflag;
  uint eflag;
  uint in_ESI;
  double extraout_XMM0_Qa;
  unit_data local_34;
  
  uVar1 = *this;
  iVar3 = rootHertzModifier(this,in_ESI);
  uVar2 = *this;
  if ((in_ESI & 1) == 0) {
    if ((~(uint)uVar2 & 0x60000000) == 0) {
      eflag = 0;
    }
    else {
      eflag = (uint)uVar2 >> 0x1e & 1;
    }
    iflag = 0;
  }
  else {
    iflag = (uint)uVar2 >> 0x1d & 1;
    eflag = (uint)uVar2 >> 0x1e & 1;
  }
  unit_data(&local_34,(((int)uVar1 << 0x1c) >> 0x1c) * in_ESI,
            (((int)uVar1 << 0x15) >> 0x1d) * in_ESI,((int)uVar1._0_1_ >> 4) * in_ESI + iVar3,
            (((int)uVar2 << 0x12) >> 0x1d) * in_ESI,(((int)uVar2 << 0xd) >> 0x1d) * in_ESI,
            (((int)uVar2 << 0xb) >> 0x1e) * in_ESI,((int)uVar2._0_2_ >> 0xe) * in_ESI,
            (((int)uVar2 << 6) >> 0x1e) * in_ESI,(((int)uVar2 << 4) >> 0x1e) * in_ESI,
            (((int)uVar2 << 8) >> 0x1d) * in_ESI,(uint)uVar2 >> 0x1c & 1,iflag,eflag,
            (uint)uVar2 >> 0x1f);
  return extraout_XMM0_Qa;
}

Assistant:

constexpr unit_data pow(int power) const
        {  // the modifier is to handle a few weird operations that operate on
           // square_root Hz,
            return {
                meter_ * power,
                kilogram_ * power,
                (second_ * power) + rootHertzModifier(power),
                ampere_ * power,
                kelvin_ * power,
                mole_ * power,
                candela_ * power,
                currency_ * power,
                count_ * power,
                radians_ * power,
                per_unit_,
                (power % 2 == 0) ? 0U : i_flag_,
                (power % 2 == 0) ? ((i_flag_ && e_flag_) ? 0U : e_flag_) :
                                   e_flag_,
                equation_};
        }